

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O1

QNetworkInformationBackend * __thiscall
QGlibNetworkInformationBackendFactory::create
          (QGlibNetworkInformationBackendFactory *this,Features requiredFeatures)

{
  bool bVar1;
  uint uVar2;
  QGlibNetworkInformationBackend *this_00;
  
  uVar2 = (**(code **)(*(long *)this + 0x70))();
  if (((uint)requiredFeatures.super_QFlagsStorageHelper<QNetworkInformation::Feature,_4>.
             super_QFlagsStorage<QNetworkInformation::Feature>.i & ~uVar2) == 0) {
    this_00 = (QGlibNetworkInformationBackend *)operator_new(0x40);
    QGlibNetworkInformationBackend::QGlibNetworkInformationBackend(this_00);
    bVar1 = QGlibNetworkInformationBackend::isValid(this_00);
    if (bVar1) {
      return (QNetworkInformationBackend *)this_00;
    }
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
  }
  return (QNetworkInformationBackend *)0x0;
}

Assistant:

QNetworkInformationBackend *create(QNetworkInformation::Features requiredFeatures) const override
    {
        if ((requiredFeatures & featuresSupported()) != requiredFeatures)
            return nullptr;
        auto backend = new QGlibNetworkInformationBackend();
        if (!backend->isValid())
            delete std::exchange(backend, nullptr);
        return backend;
    }